

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcol.c
# Opt level: O0

int ffgpxfll(fitsfile *fptr,int datatype,LONGLONG *firstpix,LONGLONG nelem,void *array,
            char *nullarray,int *anynul,int *status)

{
  int iVar1;
  long in_RCX;
  int in_ESI;
  int *in_stack_00000010;
  LONGLONG firstelem;
  LONGLONG dimsize;
  LONGLONG naxes [9];
  int nullcheck;
  int ii;
  int naxis;
  LONGLONG in_stack_000000c8;
  int in_stack_000000d4;
  fitsfile *in_stack_000000d8;
  void *in_stack_00000120;
  char *in_stack_00000128;
  int *in_stack_00000130;
  int *in_stack_00000138;
  long in_stack_000071e0;
  LONGLONG in_stack_000071e8;
  LONGLONG in_stack_000071f0;
  undefined4 in_stack_000071f8;
  float in_stack_000071fc;
  undefined4 in_stack_00007200;
  int in_stack_00007204;
  fitsfile *in_stack_00007208;
  undefined4 in_stack_00007210;
  int in_stack_00007214;
  fitsfile *in_stack_00007218;
  int in_stack_00007224;
  fitsfile *in_stack_00007228;
  int in_stack_00007250;
  char in_stack_00007258;
  undefined1 in_stack_00007259;
  undefined2 in_stack_0000725a;
  undefined4 in_stack_0000725c;
  int in_stack_00007260;
  undefined4 in_stack_00007264;
  uchar in_stack_00007268;
  undefined1 in_stack_00007269;
  undefined2 in_stack_0000726a;
  undefined4 in_stack_0000726c;
  int in_stack_00007270;
  undefined4 in_stack_00007274;
  double *in_stack_00007278;
  int *in_stack_00007280;
  int *in_stack_00007288;
  int *in_stack_00007290;
  fitsfile *in_stack_ffffffffffffff28;
  int *in_stack_ffffffffffffff30;
  fitsfile *in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  fitsfile *in_stack_ffffffffffffff48;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_c;
  
  iVar1 = (int)((ulong)in_stack_ffffffffffffff40 >> 0x20);
  if ((*in_stack_00000010 < 1) && (in_RCX != 0)) {
    ffgidm(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
           &in_stack_ffffffffffffff28->HDUposition);
    ffgiszll(in_stack_ffffffffffffff48,iVar1,(LONGLONG *)in_stack_ffffffffffffff38,
             in_stack_ffffffffffffff30);
    for (local_48 = 0; local_48 < local_44; local_48 = local_48 + 1) {
    }
    iVar1 = fits_is_compressed_image(in_stack_ffffffffffffff28,(int *)0x17413f);
    if (iVar1 == 0) {
      if (in_ESI == 0xb) {
        ffgclb(in_stack_00007218,in_stack_00007214,(LONGLONG)in_stack_00007208,
               CONCAT44(in_stack_00007204,in_stack_00007200),
               CONCAT44(in_stack_000071fc,in_stack_000071f8),in_stack_000071f0,in_stack_00007260,
               in_stack_00007268,(uchar *)CONCAT44(in_stack_00007274,in_stack_00007270),
               (char *)in_stack_00007278,in_stack_00007280,in_stack_00007288);
      }
      else if (in_ESI == 0xc) {
        ffgclsb(in_stack_00007208,in_stack_00007204,CONCAT44(in_stack_000071fc,in_stack_000071f8),
                in_stack_000071f0,in_stack_000071e8,in_stack_000071e0,in_stack_00007250,
                in_stack_00007258,(char *)CONCAT44(in_stack_00007264,in_stack_00007260),
                (char *)CONCAT44(in_stack_0000726c,
                                 CONCAT22(in_stack_0000726a,
                                          CONCAT11(in_stack_00007269,in_stack_00007268))),
                (int *)CONCAT44(in_stack_00007274,in_stack_00007270),(int *)in_stack_00007278);
      }
      else if (in_ESI == 0x14) {
        ffgclui(in_stack_00007208,in_stack_00007204,CONCAT44(in_stack_000071fc,in_stack_000071f8),
                in_stack_000071f0,in_stack_000071e8,in_stack_000071e0,in_stack_00007250,
                CONCAT11(in_stack_00007259,in_stack_00007258),
                (unsigned_short *)CONCAT44(in_stack_00007264,in_stack_00007260),
                (char *)CONCAT44(in_stack_0000726c,
                                 CONCAT22(in_stack_0000726a,
                                          CONCAT11(in_stack_00007269,in_stack_00007268))),
                (int *)CONCAT44(in_stack_00007274,in_stack_00007270),(int *)in_stack_00007278);
      }
      else if (in_ESI == 0x15) {
        ffgcli(in_stack_00007218,in_stack_00007214,(LONGLONG)in_stack_00007208,
               CONCAT44(in_stack_00007204,in_stack_00007200),
               CONCAT44(in_stack_000071fc,in_stack_000071f8),in_stack_000071f0,in_stack_00007260,
               CONCAT11(in_stack_00007269,in_stack_00007268),
               (short *)CONCAT44(in_stack_00007274,in_stack_00007270),(char *)in_stack_00007278,
               in_stack_00007280,in_stack_00007288);
      }
      else if (in_ESI == 0x1e) {
        ffgcluk(in_stack_00007208,in_stack_00007204,CONCAT44(in_stack_000071fc,in_stack_000071f8),
                in_stack_000071f0,in_stack_000071e8,in_stack_000071e0,in_stack_00007250,
                CONCAT22(in_stack_0000725a,CONCAT11(in_stack_00007259,in_stack_00007258)),
                (uint *)CONCAT44(in_stack_00007264,in_stack_00007260),
                (char *)CONCAT44(in_stack_0000726c,
                                 CONCAT22(in_stack_0000726a,
                                          CONCAT11(in_stack_00007269,in_stack_00007268))),
                (int *)CONCAT44(in_stack_00007274,in_stack_00007270),(int *)in_stack_00007278);
      }
      else if (in_ESI == 0x1f) {
        ffgclk(in_stack_00007218,in_stack_00007214,(LONGLONG)in_stack_00007208,
               CONCAT44(in_stack_00007204,in_stack_00007200),
               CONCAT44(in_stack_000071fc,in_stack_000071f8),in_stack_000071f0,in_stack_00007260,
               CONCAT22(in_stack_0000726a,CONCAT11(in_stack_00007269,in_stack_00007268)),
               (int *)CONCAT44(in_stack_00007274,in_stack_00007270),(char *)in_stack_00007278,
               in_stack_00007280,in_stack_00007288);
      }
      else if (in_ESI == 0x28) {
        ffgcluj(in_stack_00007208,in_stack_00007204,CONCAT44(in_stack_000071fc,in_stack_000071f8),
                in_stack_000071f0,in_stack_000071e8,in_stack_000071e0,in_stack_00007250,
                CONCAT44(in_stack_0000725c,
                         CONCAT22(in_stack_0000725a,CONCAT11(in_stack_00007259,in_stack_00007258))),
                (unsigned_long *)CONCAT44(in_stack_00007264,in_stack_00007260),
                (char *)CONCAT44(in_stack_0000726c,
                                 CONCAT22(in_stack_0000726a,
                                          CONCAT11(in_stack_00007269,in_stack_00007268))),
                (int *)CONCAT44(in_stack_00007274,in_stack_00007270),(int *)in_stack_00007278);
      }
      else if (in_ESI == 0x29) {
        ffgclj(in_stack_00007218,in_stack_00007214,(LONGLONG)in_stack_00007208,
               CONCAT44(in_stack_00007204,in_stack_00007200),
               CONCAT44(in_stack_000071fc,in_stack_000071f8),in_stack_000071f0,in_stack_00007260,
               CONCAT44(in_stack_0000726c,
                        CONCAT22(in_stack_0000726a,CONCAT11(in_stack_00007269,in_stack_00007268))),
               (long *)CONCAT44(in_stack_00007274,in_stack_00007270),(char *)in_stack_00007278,
               in_stack_00007280,in_stack_00007288);
      }
      else if (in_ESI == 0x50) {
        ffgclujj(in_stack_00007218,in_stack_00007214,(LONGLONG)in_stack_00007208,
                 CONCAT44(in_stack_00007204,in_stack_00007200),
                 CONCAT44(in_stack_000071fc,in_stack_000071f8),in_stack_000071f0,in_stack_00007260,
                 CONCAT44(in_stack_0000726c,
                          CONCAT22(in_stack_0000726a,CONCAT11(in_stack_00007269,in_stack_00007268)))
                 ,(ULONGLONG *)CONCAT44(in_stack_00007274,in_stack_00007270),
                 (char *)in_stack_00007278,in_stack_00007280,in_stack_00007288);
      }
      else if (in_ESI == 0x51) {
        ffgcljj(in_stack_00007218,in_stack_00007214,(LONGLONG)in_stack_00007208,
                CONCAT44(in_stack_00007204,in_stack_00007200),
                CONCAT44(in_stack_000071fc,in_stack_000071f8),in_stack_000071f0,in_stack_00007260,
                CONCAT44(in_stack_0000726c,
                         CONCAT22(in_stack_0000726a,CONCAT11(in_stack_00007269,in_stack_00007268))),
                (LONGLONG *)CONCAT44(in_stack_00007274,in_stack_00007270),(char *)in_stack_00007278,
                in_stack_00007280,in_stack_00007288);
      }
      else if (in_ESI == 0x2a) {
        ffgcle(in_stack_00007228,in_stack_00007224,(LONGLONG)in_stack_00007218,
               CONCAT44(in_stack_00007214,in_stack_00007210),(LONGLONG)in_stack_00007208,
               CONCAT44(in_stack_00007204,in_stack_00007200),in_stack_00007270,in_stack_000071fc,
               (float *)in_stack_00007278,(char *)in_stack_00007280,in_stack_00007288,
               in_stack_00007290);
      }
      else if (in_ESI == 0x52) {
        ffgcld(in_stack_00007228,in_stack_00007224,(LONGLONG)in_stack_00007218,
               CONCAT44(in_stack_00007214,in_stack_00007210),(LONGLONG)in_stack_00007208,
               CONCAT44(in_stack_00007204,in_stack_00007200),in_stack_00007270,
               (double)CONCAT44(in_stack_000071fc,in_stack_000071f8),in_stack_00007278,
               (char *)in_stack_00007280,in_stack_00007288,in_stack_00007290);
      }
      else {
        *in_stack_00000010 = 0x19a;
      }
      local_c = *in_stack_00000010;
    }
    else {
      fits_read_compressed_pixels
                (in_stack_000000d8,in_stack_000000d4,in_stack_000000c8,(LONGLONG)fptr,datatype,
                 firstpix,in_stack_00000120,in_stack_00000128,in_stack_00000130,in_stack_00000138);
      local_c = *in_stack_00000010;
    }
  }
  else {
    local_c = *in_stack_00000010;
  }
  return local_c;
}

Assistant:

int ffgpxfll( fitsfile *fptr, /* I - FITS file pointer                       */
            int  datatype,    /* I - datatype of the value                   */
            LONGLONG *firstpix, /* I - coord of first pixel to read (1s based) */
            LONGLONG nelem,       /* I - number of values to read              */
            void *array,      /* O - array of values that are returned       */
            char *nullarray,  /* O - returned array of null value flags      */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
  Read an array of values from the primary array. The datatype of the
  input array is defined by the 2nd argument.  Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being read).
  The nullarray values will = 1 if the corresponding array value is null.
  ANYNUL is returned with a value of .true. if any pixels are undefined.
*/
{
    int naxis, ii;
    int nullcheck = 2;
    LONGLONG naxes[9];
    LONGLONG dimsize = 1, firstelem;

    if (*status > 0 || nelem == 0)   /* inherit input status value if > 0 */
        return(*status);

    /* get the size of the image */
    ffgidm(fptr, &naxis, status);
    ffgiszll(fptr, 9, naxes, status);

    /* calculate the position of the first element in the array */
    firstelem = 0;
    for (ii=0; ii < naxis; ii++)
    {
        firstelem += ((firstpix[ii] - 1) * dimsize);
        dimsize *= naxes[ii];
    }
    firstelem++;

    if (fits_is_compressed_image(fptr, status))
    {
        /* this is a compressed image in a binary table */

        fits_read_compressed_pixels(fptr, datatype, firstelem, nelem,
            nullcheck, NULL, array, nullarray, anynul, status);
        return(*status);
    }

    /*
      the primary array is represented as a binary table:
      each group of the primary array is a row in the table,
      where the first column contains the group parameters
      and the second column contains the image itself.
    */

    if (datatype == TBYTE)
    {
        ffgclb(fptr, 2, 1, firstelem, nelem, 1, 2, 0,
               (unsigned char *) array, nullarray, anynul, status);
    }
    else if (datatype == TSBYTE)
    {
        ffgclsb(fptr, 2, 1, firstelem, nelem, 1, 2, 0,
               (signed char *) array, nullarray, anynul, status);
    }
    else if (datatype == TUSHORT)
    {
        ffgclui(fptr, 2, 1, firstelem, nelem, 1, 2, 0,
               (unsigned short *) array, nullarray, anynul, status);
    }
    else if (datatype == TSHORT)
    {
        ffgcli(fptr, 2, 1, firstelem, nelem, 1, 2, 0,
               (short *) array, nullarray, anynul, status);
    }
    else if (datatype == TUINT)
    {
        ffgcluk(fptr, 2, 1, firstelem, nelem, 1, 2, 0,
               (unsigned int *) array, nullarray, anynul, status);
    }
    else if (datatype == TINT)
    {
        ffgclk(fptr, 2, 1, firstelem, nelem, 1, 2, 0,
               (int *) array, nullarray, anynul, status);
    }
    else if (datatype == TULONG)
    {
        ffgcluj(fptr, 2, 1, firstelem, nelem, 1, 2, 0,
               (unsigned long *) array, nullarray, anynul, status);
    }
    else if (datatype == TLONG)
    {
        ffgclj(fptr, 2, 1, firstelem, nelem, 1, 2, 0,
               (long *) array, nullarray, anynul, status);
    }
    else if (datatype == TULONGLONG)
    {
        ffgclujj(fptr, 2, 1, firstelem, nelem, 1, 2, 0,
               (ULONGLONG *) array, nullarray, anynul, status);
    }
    else if (datatype == TLONGLONG)
    {
        ffgcljj(fptr, 2, 1, firstelem, nelem, 1, 2, 0,
               (LONGLONG *) array, nullarray, anynul, status);
    }
    else if (datatype == TFLOAT)
    {
        ffgcle(fptr, 2, 1, firstelem, nelem, 1, 2, 0,
               (float *) array, nullarray, anynul, status);
    }
    else if (datatype == TDOUBLE)
    {
        ffgcld(fptr, 2, 1, firstelem, nelem, 1, 2, 0,
               (double *) array, nullarray, anynul, status);
    }
    else
      *status = BAD_DATATYPE;

    return(*status);
}